

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void search_tx_type(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                   BLOCK_SIZE plane_bsize,TX_SIZE tx_size,TXB_CTX *txb_ctx,
                   FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis,int64_t ref_best_rd,
                   RD_STATS *best_rd_stats)

{
  CommonQuantParams *pCVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  tran_low_t *ptVar5;
  AV1_PRIMARY *pAVar6;
  tran_low_t *ptVar7;
  MB_MODE_INFO *pMVar8;
  byte bVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  byte bVar16;
  byte bVar17;
  _Bool _Var18;
  TX_TYPE tx_type;
  ushort uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  TxfmParam *pTVar24;
  uint64_t uVar25;
  RD_STATS *pRVar26;
  ushort *puVar27;
  qm_val_t *pqVar28;
  int64_t iVar29;
  ulong uVar30;
  byte bVar31;
  char cVar32;
  uint uVar33;
  AV1_COMMON *cm;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  QUANT_PARAM *__s;
  TX_TYPE TVar40;
  int idx;
  uint uVar41;
  uint uVar42;
  uint16_t uVar43;
  ulong uVar44;
  int64_t *piVar45;
  ulong uVar46;
  long lVar47;
  int16_t *piVar48;
  uint *puVar49;
  undefined7 uVar52;
  TxfmParam *l;
  long lVar50;
  ulong uVar51;
  uint uVar53;
  int16_t *piVar54;
  qm_val_t *pqVar55;
  PREDICTION_MODE *pPVar56;
  qm_val_t *pqVar57;
  long lVar58;
  uint uVar59;
  uint uVar60;
  MACROBLOCKD *xd;
  int (*paiVar61) [16];
  macroblockd *xd_00;
  int iVar62;
  uint uVar63;
  bool bVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  double dVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  uint uVar78;
  float fVar79;
  float fVar80;
  uint uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float local_7d8;
  undefined8 local_7c8;
  undefined1 local_7a8 [16];
  undefined4 local_75c;
  int rate_cost;
  undefined8 local_748;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  NN_CONFIG *local_738;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  macroblock_plane *local_728;
  ulong local_720;
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  macroblockd *local_6f8;
  long local_6f0;
  undefined8 local_6e8;
  uint local_6e0;
  uint block_mse_q8;
  undefined1 local_6d8 [16];
  tran_low_t **local_6c8;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  TxfmParam txfm_param_2;
  int64_t dist;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  int visible_cols;
  int iStack_634;
  undefined8 local_630;
  qm_val_t *local_628;
  qm_val_t *pqStack_620;
  undefined1 local_618;
  undefined7 uStack_617;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  int16_t *local_5e8;
  undefined8 uStack_5e0;
  long local_5d0;
  MB_MODE_INFO *local_5c8;
  int64_t dist_1;
  int16_t *local_5b8;
  undefined4 uStack_5b0;
  float fStack_5ac;
  TxfmParam txfm_param;
  undefined1 local_568 [16];
  long local_558;
  tran_low_t *local_550;
  NN_CONFIG *local_538;
  int idx_h [4];
  int idx_v [4];
  int skip_h [4];
  int txk_map [16];
  int skip_v [4];
  int64_t local_450;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  QUANT_PARAM quant_param;
  
  local_5c8 = *(x->e_mbd).mi;
  rate_cost = 0;
  if (plane == 0) {
    local_558 = (long)((x->e_mbd).tx_type_map_stride * blk_row + blk_col);
  }
  else {
    local_558 = 0;
  }
  local_728 = x->plane + plane;
  ptVar5 = x->plane[plane].dqcoeff;
  local_550 = x->dqcoeff_buf;
  best_rd_stats->rate = 0x7fffffff;
  best_rd_stats->zero_rate = 0;
  best_rd_stats->dist = 0x7fffffffffffffff;
  best_rd_stats->rdcost = 0x7fffffffffffffff;
  best_rd_stats->sse = 0x7fffffffffffffff;
  best_rd_stats->skip_txfm = '\0';
  txk_map[0xc] = 0xc;
  txk_map[0xd] = 0xd;
  txk_map[0xe] = 0xe;
  txk_map[0xf] = 0xf;
  txk_map[8] = 8;
  txk_map[9] = 9;
  txk_map[10] = 10;
  txk_map[0xb] = 0xb;
  txk_map[4] = 4;
  txk_map[5] = 5;
  txk_map[6] = 6;
  txk_map[7] = 7;
  txk_map[0] = 0;
  txk_map[1] = 1;
  txk_map[2] = 2;
  txk_map[3] = 3;
  uVar34 = ((x->e_mbd).cur_buf)->flags;
  if ((uVar34 & 8) == 0) {
    bVar31 = 3;
  }
  else {
    bVar31 = (char)(x->e_mbd).bd - 5;
  }
  iVar62 = (int)local_728->dequant_QTX[1];
  cm = &cpi->common;
  uVar38 = (ulong)tx_size;
  local_6f8 = &x->e_mbd;
  pTVar24 = (TxfmParam *)(ulong)plane_bsize;
  local_6f0 = (long)block;
  local_6e8 = CONCAT44(local_6e8._4_4_,iVar62 >> (bVar31 & 0x1f));
  local_720 = CONCAT71(local_720._1_7_,
                       (cpi->optimize_seg_arr[*(ushort *)&local_5c8->field_0xa7 & 7] & 0xfd) == 0);
  if ((((x->txfm_search_params).predict_dc_level == 0) || ((0x3efefUL >> (uVar38 & 0x3f) & 1) == 0))
     || ((0x5f7efUL >> (uVar38 & 0x3f) & 1) == 0)) {
    l = pTVar24;
    uVar25 = av1_pixel_diff_dist(x,plane,blk_row,blk_col,plane_bsize,txsize_to_bsize[uVar38],
                                 &block_mse_q8);
    local_5d0 = 0x7fffffffffffffff;
    pRVar26 = (RD_STATS *)0x7fffffffffffffff;
  }
  else {
    if ((uVar34 & 8) == 0) {
      bVar31 = 3;
    }
    else {
      bVar31 = (char)(x->e_mbd).bd - 5;
    }
    sVar2 = *local_728->dequant_QTX;
    get_txb_dimensions(local_6f8,plane,plane_bsize,blk_row,blk_col,txsize_to_bsize[uVar38],
                       (int *)0x0,(int *)0x0,&visible_cols,&quant_param.log_scale);
    iVar21 = quant_param.log_scale;
    iVar20 = visible_cols;
    l = &txfm_param;
    txfm_param._0_8_ = txfm_param._0_8_ & 0xffffffff00000000;
    uVar25 = (*aom_sum_sse_2d_i16)
                       (local_728->src_diff +
                        (int)(((uint)pTVar24[0x2ed4e].tx_set_type * blk_row + blk_col) * 4),
                        (uint)pTVar24[0x2ed4e].tx_set_type,visible_cols,quant_param.log_scale,
                        (int *)l);
    if (iVar21 < 1 || iVar20 < 1) {
      block_mse_q8 = 0xffffffff;
      uVar30 = 0xffffffffffffffff;
      local_5d0 = 0x7fffffffffffffff;
    }
    else {
      iVar22 = -txfm_param._0_4_;
      if (0 < (int)txfm_param._0_4_) {
        iVar22 = txfm_param._0_4_;
      }
      dVar68 = 1.0 / (double)(iVar21 * iVar20);
      local_5d0 = (long)((double)iVar22 * dVar68) * -0x80;
      if (0 < (int)txfm_param._0_4_) {
        local_5d0 = (long)((double)iVar22 * dVar68) * 0x80;
      }
      auVar72._8_4_ = (int)(uVar25 >> 0x18);
      auVar72._0_8_ = uVar25 << 8;
      auVar72._12_4_ = 0x45300000;
      block_mse_q8 = (uint)(long)(((auVar72._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)(uVar25 << 8)) -
                                  4503599627370496.0)) * dVar68);
      dVar68 = dVar68 * (double)(int)txfm_param._0_4_ * (double)(int)txfm_param._0_4_;
      uVar30 = (ulong)dVar68;
      uVar30 = uVar25 - ((long)(dVar68 - 9.223372036854776e+18) & (long)uVar30 >> 0x3f | uVar30);
    }
    dVar68 = (double)(iVar62 >> (bVar31 & 0x1f));
    dVar68 = dVar68 * 1.8 * dVar68;
    uVar37 = (ulong)dVar68;
    uVar34 = ((x->e_mbd).cur_buf)->flags;
    if ((uVar34 & 8) != 0) {
      bVar31 = (char)(x->e_mbd).bd * '\x02' - 0x10;
      uVar30 = uVar30 + ((uint)(1 << (bVar31 & 0x1f)) >> 1) >> (bVar31 & 0x3f);
    }
    if (uVar30 < ((long)(dVar68 - 9.223372036854776e+18) & (long)uVar37 >> 0x3f | uVar37)) {
      lVar47 = -local_5d0;
      if (0 < local_5d0) {
        lVar47 = local_5d0;
      }
      if ((long)((ulong)dc_coeff_scale[uVar38] * lVar47) < (long)(((int)sVar2 >> 3) << 0xc)) {
        best_rd_stats->skip_txfm = '\x01';
        local_728->eobs[local_6f0] = 0;
        if ((uVar34 & 8) != 0) {
          bVar31 = (char)(x->e_mbd).bd * '\x02' - 0x10;
          uVar25 = (long)(uVar25 + ((uint)(1 << (bVar31 & 0x1f)) >> 1)) >> (bVar31 & 0x3f);
        }
        best_rd_stats->dist = uVar25 << 4;
        best_rd_stats->sse = uVar25 << 4;
        av1_get_entropy_contexts
                  (plane_bsize,(macroblockd_plane *)&(x->e_mbd).plane[plane].plane_type,
                   (ENTROPY_CONTEXT *)&quant_param,(ENTROPY_CONTEXT *)&visible_cols);
        bVar31 = ""[uVar38];
        bVar16 = ""[uVar38];
        l = (TxfmParam *)&visible_cols;
        get_txb_ctx(plane_bsize,tx_size,plane,(ENTROPY_CONTEXT *)&quant_param,(ENTROPY_CONTEXT *)l,
                    (TXB_CTX *)&txfm_param);
        iVar62 = (x->coeff_costs).coeff_costs[(uint)bVar31 + (uint)bVar16 + 1 >> 1 & 0xff]
                 [plane != 0].txb_skip_cost[(int)txfm_param._0_4_][1];
        best_rd_stats->rate = iVar62;
        best_rd_stats->rdcost =
             best_rd_stats->sse * 0x80 + ((long)x->rdmult * (long)iVar62 + 0x100 >> 9);
        local_728->txb_entropy_ctx[local_6f0] = '\0';
      }
      else if ((1 < (x->txfm_search_params).predict_dc_level) &&
              ((plane == 0 ||
               ((0 < plane &&
                (((local_5c8->field_0xa7 & 0x80) != 0 || ('\0' < local_5c8->ref_frame[0])))))))) {
        if (best_rd_stats->skip_txfm == '\x01') goto LAB_0021a54e;
        uVar34 = 1;
        uVar52 = (undefined7)((ulong)l >> 8);
        bVar65 = true;
        local_75c = 0;
        goto LAB_0021a7b6;
      }
    }
    pRVar26 = best_rd_stats;
    if (best_rd_stats->skip_txfm == '\x01') {
LAB_0021a54e:
      if (plane != 0) {
        return;
      }
      (x->e_mbd).tx_type_map[local_558] = '\0';
      return;
    }
  }
  uVar34 = 1;
  local_75c = (undefined4)CONCAT71((int7)((ulong)pRVar26 >> 8),1);
  if ((cpi->sf).rt_sf.dct_only_palette_nonrd == 1) {
    uVar52 = (undefined7)((ulong)l >> 8);
    bVar65 = true;
    goto LAB_0021a7b6;
  }
  pMVar8 = *(x->e_mbd).mi;
  uVar3 = *(ushort *)&pMVar8->field_0xa7;
  uVar36 = 1;
  if (-1 < (char)uVar3) {
    uVar36 = (uint)('\0' < pMVar8->ref_frame[0]);
  }
  pAVar6 = cpi->ppi;
  uVar30 = (ulong)(pAVar6->gf_group).update_type[cpi->gf_frame_index];
  paiVar61 = (pAVar6->frame_probs).tx_type_probs[uVar30] + tx_size;
  if (uVar36 == 0) {
    if ((x->txfm_search_params).use_default_intra_tx_type == 0) goto LAB_0021a576;
LAB_0021a125:
    if (((char)uVar3 < '\0') || ('\0' < pMVar8->ref_frame[0])) {
      bVar31 = 0;
    }
    else {
      bVar31 = 0;
      if ((tx_size < 3) &&
         (cpi->use_screen_content_tools == 0 && (x->e_mbd).lossless[uVar3 & 7] == 0)) {
        bVar31 = intra_mode_to_tx_type__intra_mode_to_tx_type[pMVar8->mode];
      }
    }
  }
  else {
    iVar62 = (x->txfm_search_params).default_inter_tx_type_prob_thresh;
    if (iVar62 == 0x7fffffff) {
LAB_0021a576:
      bVar31 = 0x10;
      if (plane == 0) {
        bVar31 = (x->rd_model != '\x01') << 4;
      }
    }
    else {
      if (iVar62 == 0) goto LAB_0021a125;
      bVar31 = 0;
      if ((*paiVar61)[0] <= iVar62) {
        uVar46 = 0;
        uVar37 = 0;
        iVar20 = 0;
        while (uVar46 != 0xf) {
          iVar21 = (pAVar6->frame_probs).tx_type_probs[uVar30][tx_size][uVar46 + 1];
          uVar46 = uVar46 + 1;
          iVar22 = iVar20;
          if (iVar20 < iVar21) {
            iVar22 = iVar21;
          }
          uVar51 = uVar37 & 0xff;
          bVar65 = iVar21 <= iVar20;
          uVar37 = uVar46 & 0xffffffff;
          iVar20 = iVar22;
          if (bVar65) {
            uVar37 = uVar51;
          }
        }
        bVar31 = (byte)uVar37;
        if (iVar20 <= iVar62 + 100) goto LAB_0021a576;
      }
    }
  }
  _Var18 = (cpi->common).features.reduced_tx_set_used;
  bVar16 = av1_get_ext_tx_set_type(tx_size,uVar36,(uint)_Var18);
  if (plane == 0) {
    bVar17 = 0;
  }
  else {
    bVar17 = av1_get_tx_type(local_6f8,'\x01',blk_row,blk_col,tx_size,(uint)_Var18);
    bVar31 = bVar17;
  }
  auVar72 = local_6d8;
  if ((pMVar8->filter_intra_mode_info).use_filter_intra == '\0') {
    pPVar56 = &pMVar8->mode;
  }
  else {
    pPVar56 = "" + (pMVar8->filter_intra_mode_info).filter_intra_mode;
  }
  iVar62 = (cpi->sf).tx_sf.tx_type_search.use_reduced_intra_txset;
  uVar37 = (ulong)bVar16;
  puVar27 = av1_reduced_intra_tx_used_flag + *pPVar56;
  if (bVar16 != 3) {
    puVar27 = av1_ext_tx_used_flag + uVar37;
  }
  if (iVar62 == 0) {
    puVar27 = av1_ext_tx_used_flag + uVar37;
  }
  uVar19 = *puVar27;
  if (iVar62 == 2) {
    uVar19 = uVar19 & av1_derived_intra_tx_used_flag[*pPVar56];
  }
  if ((((x->e_mbd).lossless[uVar3 & 7] == 0) && ((0x61810UL >> (uVar38 & 0x3f) & 1) == 0)) &&
     (uVar19 != 1)) {
    if (uVar36 == 0) {
      if ((cpi->oxcf).txfm_cfg.use_intra_dct_only == true) goto LAB_0021a677;
    }
    else if ((cpi->oxcf).txfm_cfg.use_inter_dct_only != false) goto LAB_0021a677;
  }
  else {
LAB_0021a677:
    bVar31 = 0;
  }
  uVar34 = uVar19 & 0xf;
  if ((cpi->oxcf).txfm_cfg.enable_flip_idtx != false) {
    uVar34 = (uint)uVar19;
  }
  if (bVar31 < 0x10) {
    uVar34 = uVar34 & 1 << (bVar31 & 0x1f);
  }
  else if ((ftxs_mode & 1) == 0) {
    lVar47 = (long)(cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats;
    if (lVar47 != 0) {
      iVar62 = -1;
      uVar35 = 0;
      uVar23 = 0;
      for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 1) {
        iVar20 = (*paiVar61)[lVar50];
        uVar63 = 1 << ((byte)lVar50 & 0x1f);
        uVar59 = (uint)lVar50;
        iVar21 = iVar20;
        if ((uVar34 >> ((uint)lVar50 & 0x1f) & 1) == 0) {
          uVar59 = uVar23;
          iVar21 = iVar62;
        }
        if (iVar62 < iVar20) {
          uVar23 = uVar59;
          iVar62 = iVar21;
        }
        if (*(int *)(lVar47 * 0x1c + 0x464484 + uVar30 * 4) <= iVar20) {
          uVar63 = 0;
        }
        uVar35 = uVar35 | uVar63;
      }
      bVar9 = (byte)uVar23 & 0x1f;
      uVar59 = 0xffff;
      if (((uVar35 & 0xffff) >> (uVar23 & 0x1f) & 1) != 0) {
        uVar59 = -2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9;
      }
      uVar34 = uVar34 & ~(uVar59 & uVar35);
    }
    uVar37 = (ulong)uVar34;
    uVar35 = 0;
    for (uVar23 = 0; uVar23 != 0x10; uVar23 = uVar23 + 1) {
      uVar35 = uVar35 + ((uVar34 >> (uVar23 & 0x1f) & 1) != 0);
    }
    if ((uVar35 < 3) || ((cpi->sf).tx_sf.tx_type_search.prune_tx_type_est_rd == 0)) {
      uVar23 = (x->txfm_search_params).prune_2d_txfm_mode;
      if (((0 < (int)uVar23 && uVar36 != 0) &&
          (((uint)(uVar23 < 4) * 4 + 1 < uVar35 && (0xfd < (byte)(bVar16 - 6))))) &&
         ((0x61e7UL >> (uVar38 & 0x3f) & 1) != 0)) {
        uVar30 = (ulong)((uint)tx_size * 8);
        local_738 = *(NN_CONFIG **)((long)av1_tx_type_nnconfig_map_hor + uVar30);
        uVar37 = (ulong)((uint)tx_size * 4);
        uVar36 = *(uint *)((long)tx_size_wide + uVar37);
        local_708._0_4_ = uVar36 >> (~(byte)(0xa0e3L >> (tx_size & 0x3f)) & 1);
        uVar35 = *(uint *)((long)tx_size_high + uVar37);
        local_718._0_4_ = uVar35 >> (~(byte)(0x14163L >> (tx_size & 0x3f)) & 1);
        bVar9 = pTVar24[0x2ed4e].tx_set_type;
        local_5e8 = (int16_t *)CONCAT44(local_5e8._4_4_,blk_row * (uint)bVar9 * 4);
        bVar65 = (0x6be9cUL >> (uVar38 & 0x3f) & 1) != 0;
        iVar62 = (int)uVar36 >> ((0x75f1cUL >> (uVar38 & 0x3f) & 1) != 0);
        local_748 = *(NN_CONFIG **)((long)av1_tx_type_nnconfig_map_ver + uVar30);
        local_5b8 = x->plane[0].src_diff;
        local_6d8._4_4_ = 0;
        local_6d8._0_4_ = (int)uVar35 >> bVar65;
        local_6d8._8_8_ = auVar72._8_8_;
        uVar59 = ((int)uVar35 >> bVar65) * iVar62;
        local_5f8 = CONCAT44(local_5f8._4_4_,blk_col * 4);
        __s = &quant_param;
        uVar37 = 0;
        memset(__s,0,(long)(int)uVar59 << 2);
        local_6c8 = (tran_low_t **)CONCAT44(local_6c8._4_4_,uVar35);
        uVar30 = 0;
        if (0 < (int)uVar35) {
          uVar30 = (ulong)uVar35;
        }
        piVar48 = local_5b8 + (long)(int)local_5e8._0_4_ + (long)(int)local_5f8;
        if ((0x75f1cUL >> (uVar38 & 0x3f) & 1) == 0) {
          uVar46 = 0;
          if (0 < (int)uVar36) {
            uVar46 = (ulong)uVar36;
          }
          piVar54 = piVar48;
          for (; uVar37 != uVar30; uVar37 = uVar37 + 1) {
            for (uVar51 = 0; uVar46 != uVar51; uVar51 = uVar51 + 1) {
              (&quant_param.log_scale)[(long)(int)(((uint)uVar37 >> bVar65) * iVar62) + uVar51] =
                   (&quant_param.log_scale)[(long)(int)(((uint)uVar37 >> bVar65) * iVar62) + uVar51]
                   + (int)piVar54[uVar51] * (int)piVar54[uVar51];
            }
            piVar54 = (int16_t *)((long)piVar54 + (ulong)((uint)bVar9 * 2));
          }
        }
        else {
          piVar54 = local_5b8 + (long)(int)local_5e8._0_4_ + (long)(int)local_5f8 + 1;
          for (uVar37 = 0; uVar37 != uVar30; uVar37 = uVar37 + 1) {
            uVar35 = ((uint)uVar37 >> bVar65) * iVar62;
            for (uVar46 = 0; uVar46 < uVar36; uVar46 = uVar46 + 2) {
              *(int *)((long)&quant_param.log_scale + uVar46 * 2 + (ulong)uVar35 * 4) =
                   (int)piVar54[uVar46 - 1] * (int)piVar54[uVar46 - 1] +
                   *(int *)((long)&quant_param.log_scale + uVar46 * 2 + (ulong)uVar35 * 4) +
                   (int)piVar54[uVar46] * (int)piVar54[uVar46];
            }
            piVar54 = (int16_t *)((long)piVar54 + (ulong)((uint)bVar9 * 2));
          }
        }
        uVar37 = 0;
        uVar30 = (ulong)uVar59;
        if ((int)uVar59 < 1) {
          uVar30 = uVar37;
        }
        uVar46 = 0;
        for (; uVar30 != uVar37; uVar37 = uVar37 + 1) {
          uVar46 = uVar46 + (uint)(&quant_param.log_scale)[uVar37];
        }
        if (uVar46 == 0) {
          iVar20 = iVar62;
          if (iVar62 < 2) {
            iVar20 = 1;
          }
          for (uVar30 = 0; iVar20 - 1 != uVar30; uVar30 = uVar30 + 1) {
            (&visible_cols)[uVar30] = (int)(1.0 / (float)iVar62);
          }
          iVar20 = local_6d8._0_4_;
          iVar62 = 1;
          if (1 < iVar20) {
            iVar62 = iVar20;
          }
          for (uVar30 = 0; iVar62 - 1 != uVar30; uVar30 = uVar30 + 1) {
            *(float *)(&txfm_param.tx_type + uVar30 * 4) = 1.0 / (float)iVar20;
          }
        }
        else {
          uVar35 = iVar62 - 1;
          uVar37 = 0;
          local_5e8 = piVar48;
          memset(&visible_cols,0,(long)(int)uVar35 * 4);
          uVar59 = local_6d8._0_4_ - 1;
          memset(&txfm_param,0,(long)local_6d8._0_4_ * 4 - 4);
          uVar30 = (ulong)uVar35;
          if ((int)uVar35 < 1) {
            uVar30 = uVar37;
          }
          uVar51 = (ulong)uVar59;
          if ((int)uVar59 < 1) {
            uVar51 = uVar37;
          }
          for (; piVar48 = local_5e8, uVar37 != uVar51; uVar37 = uVar37 + 1) {
            for (uVar44 = 0; uVar30 != uVar44; uVar44 = uVar44 + 1) {
              uVar35 = (&__s->log_scale)[uVar44];
              (&visible_cols)[uVar44] = (int)((float)(&visible_cols)[uVar44] + (float)uVar35);
              *(float *)(&txfm_param.tx_type + uVar37 * 4) =
                   (float)uVar35 + *(float *)(&txfm_param.tx_type + uVar37 * 4);
            }
            *(float *)(&txfm_param.tx_type + uVar37 * 4) =
                 (float)(uint)(&quant_param.log_scale)[uVar37 * (long)iVar62 + uVar30] +
                 *(float *)(&txfm_param.tx_type + uVar37 * 4);
            __s = (QUANT_PARAM *)(&__s->log_scale + iVar62);
          }
          for (uVar37 = 0; uVar30 != uVar37; uVar37 = uVar37 + 1) {
            (&visible_cols)[uVar37] =
                 (int)((float)(uint)(&quant_param.log_scale)[(long)(iVar62 * (int)uVar51) + uVar37]
                      + (float)(&visible_cols)[uVar37]);
          }
          for (uVar37 = 0; uVar30 != uVar37; uVar37 = uVar37 + 1) {
            (&visible_cols)[uVar37] = (int)((float)(&visible_cols)[uVar37] * (1.0 / (float)uVar46));
          }
          for (uVar30 = 0; uVar51 != uVar30; uVar30 = uVar30 + 1) {
            *(float *)(&txfm_param.tx_type + uVar30 * 4) =
                 *(float *)(&txfm_param.tx_type + uVar30 * 4) * (1.0 / (float)uVar46);
          }
        }
        (*av1_get_horver_correlation_full)
                  (piVar48,(uint)bVar9,uVar36,(int)local_6c8._0_4_,
                   (float *)((long)&uStack_640 + (long)(int)local_708._0_4_ * 4 + 4),
                   &fStack_5ac + (int)local_718._0_4_);
        (*av1_nn_predict)((float *)&visible_cols,local_738,1,(float *)idx_v);
        (*av1_nn_predict)((float *)&txfm_param,local_748,1,(float *)idx_h);
        for (lVar47 = 0; lVar47 != 0x10; lVar47 = lVar47 + 4) {
          fVar71 = *(float *)((long)idx_h + lVar47);
          lVar50 = lVar47 * 4;
          (&quant_param.log_scale)[lVar47] = (int)(fVar71 * (float)idx_v[0]);
          *(float *)(&quant_param.tx_size + lVar50) = fVar71 * (float)idx_v[1];
          *(float *)((long)&quant_param.qmatrix + lVar50) = fVar71 * (float)idx_v[2];
          *(float *)((long)&quant_param.qmatrix + lVar50 + 4) = fVar71 * (float)idx_v[3];
        }
        (*av1_nn_fast_softmax_16)((float *)&quant_param,(float *)&quant_param);
        if (bVar16 == 4) {
          fVar71 = av1_tx_type_nn_bias_16x4_ver_layer1[((ulong)uVar23 & 0xff) * 2 + 3];
        }
        else {
          fVar71 = 0.0;
          if (bVar16 == 5) {
            fVar71 = av1_tx_type_nn_bias_16x4_ver_layer1[((ulong)uVar23 & 0xff) * 2 + 2];
          }
        }
        fVar71 = prune_2D_adaptive_thresholds[uVar38][(int)fVar71];
        local_648 = 0xff000000ff;
        uStack_640 = 0xff000000ff;
        local_658 = 0xff000000ff;
        uStack_650 = 0xff000000ff;
        local_668 = 0xff000000ff;
        uStack_660 = 0xff000000ff;
        dist = 0xff000000ff;
        uStack_670 = 0xff000000ff;
        txfm_param_2.tx_set_type = '\0';
        txfm_param_2._17_3_ = 0xbf8000;
        txfm_param_2.eob = -0x40800000;
        txfm_param_2.tx_type = '\0';
        txfm_param_2.tx_size = '\0';
        txfm_param_2._2_2_ = 0xbf80;
        txfm_param_2.lossless = -0x40800000;
        txfm_param_2.bd = -0x40800000;
        txfm_param_2.is_hbd = -0x40800000;
        fVar76 = 0.0;
        puVar49 = &prune_tx_2D_tx_type_table_2D;
        uVar35 = 0;
        uVar30 = 0;
        fVar87 = 0.0;
        uVar36 = 0;
        for (uVar37 = 0; lVar47 = (long)(int)uVar36, uVar37 != 0x10; uVar37 = uVar37 + 1) {
          uVar59 = *puVar49;
          if ((uVar34 >> (uVar59 & 0x1f) & 1) != 0) {
            fVar86 = (float)(&quant_param.log_scale)[uVar37];
            if (fVar76 < fVar86) {
              uVar30 = uVar37 & 0xffffffff;
              fVar76 = fVar86;
            }
            if (fVar71 <= fVar86) {
              uVar35 = uVar35 | 1 << ((byte)uVar59 & 0x1f);
              fVar87 = fVar87 + fVar86;
              *(float *)(&txfm_param_2.tx_type + lVar47 * 4) = fVar86;
              *(uint *)((long)&dist + lVar47 * 4) = uVar59;
              uVar36 = uVar36 + 1;
            }
          }
          puVar49 = puVar49 + 1;
        }
        piVar45 = (int64_t *)&prune_tx_2D_tx_type_table_2D;
        if (((uVar35 & 0xffff) >> ((&prune_tx_2D_tx_type_table_2D)[(int)uVar30] & 0x1f) & 1) == 0) {
          uVar34 = uVar35 | 1 << ((byte)(&prune_tx_2D_tx_type_table_2D)[(int)uVar30] & 0x1f);
          uVar37 = (ulong)uVar34;
        }
        else {
          fVar71 = (float)txfm_param_2._0_4_;
          if ((float)txfm_param_2.lossless <= (float)txfm_param_2._0_4_) {
            fVar71 = (float)txfm_param_2.lossless;
          }
          uVar34 = dist._4_4_;
          if ((float)txfm_param_2.lossless > (float)txfm_param_2._0_4_) {
            uVar34 = (uint)dist;
            dist._0_4_ = dist._4_4_;
          }
          fVar76 = (float)txfm_param_2.bd;
          if ((float)txfm_param_2.is_hbd <= (float)txfm_param_2.bd) {
            fVar76 = (float)txfm_param_2.is_hbd;
          }
          uVar59 = uStack_670._4_4_;
          if ((float)txfm_param_2.is_hbd > (float)txfm_param_2.bd) {
            uVar59 = (uint)uStack_670;
            uStack_670._0_4_ = uStack_670._4_4_;
          }
          fVar86 = (float)txfm_param_2._16_4_;
          if ((float)txfm_param_2.eob <= (float)txfm_param_2._16_4_) {
            fVar86 = (float)txfm_param_2.eob;
          }
          uVar63 = local_668._4_4_;
          if ((float)txfm_param_2.eob > (float)txfm_param_2._16_4_) {
            uVar63 = (uint)local_668;
            local_668._0_4_ = local_668._4_4_;
          }
          fVar69 = (float)(~-(uint)((float)txfm_param_2._0_4_ < (float)txfm_param_2.lossless) &
                           txfm_param_2._0_4_ |
                          txfm_param_2.lossless &
                          -(uint)((float)txfm_param_2._0_4_ < (float)txfm_param_2.lossless));
          fVar73 = (float)(~-(uint)((float)txfm_param_2.bd < (float)txfm_param_2.is_hbd) &
                           txfm_param_2.bd |
                          txfm_param_2.is_hbd &
                          -(uint)((float)txfm_param_2.bd < (float)txfm_param_2.is_hbd));
          fVar88 = (float)(~-(uint)((float)txfm_param_2._16_4_ < (float)txfm_param_2.eob) &
                           txfm_param_2._16_4_ |
                          txfm_param_2.eob &
                          -(uint)((float)txfm_param_2._16_4_ < (float)txfm_param_2.eob));
          fVar80 = -1.0;
          uVar66 = -(uint)(fVar69 < fVar73);
          local_7d8 = -1.0;
          if ((int)uVar36 < 9) {
            uVar33 = (uint)uStack_670;
            fVar84 = fVar73;
            if (fVar69 < fVar73) {
              uVar33 = (uint)dist;
              fVar84 = fVar69;
              dist._0_4_ = (uint)uStack_670;
            }
            fVar79 = fVar71;
            if (fVar76 <= fVar71) {
              fVar79 = fVar76;
            }
            uVar41 = uVar59;
            if (fVar76 > fVar71) {
              uVar41 = uVar34;
              uVar34 = uVar59;
            }
            fVar85 = fVar88;
            if (-1.0 <= fVar88) {
              fVar85 = fVar80;
            }
            fVar71 = (float)(~-(uint)(fVar71 < fVar76) & (uint)fVar71 |
                            (uint)fVar76 & -(uint)(fVar71 < fVar76));
            uVar59 = (uint)uStack_660;
            if (-1.0 > fVar88) {
              uVar59 = (uint)local_668;
              local_668._0_4_ = (uint)uStack_660;
            }
            fVar80 = (float)(~-(uint)(fVar86 < -1.0) & (uint)fVar86 |
                            -(uint)(fVar86 < -1.0) & 0xbf800000);
            fVar76 = fVar86;
            if (-1.0 <= fVar86) {
              fVar76 = local_7d8;
            }
            fVar73 = (float)(~uVar66 & (uint)fVar69 | uVar66 & (uint)fVar73);
            uVar66 = uStack_660._4_4_;
            if (-1.0 > fVar86) {
              uVar66 = uVar63;
              uVar63 = uStack_660._4_4_;
            }
            txfm_param_2._16_4_ =
                 ~-(uint)(fVar88 < -1.0) & (uint)fVar88 | -(uint)(fVar88 < -1.0) & 0xbf800000;
            fVar86 = fVar71;
            if (fVar84 <= fVar71) {
              fVar86 = fVar84;
            }
            uVar81 = uVar33;
            if (fVar84 > fVar71) {
              uVar81 = uVar34;
              uVar34 = uVar33;
            }
            fVar88 = fVar80;
            if (fVar85 <= fVar80) {
              fVar88 = fVar85;
            }
            fVar71 = (float)(~-(uint)(fVar71 < fVar84) & (uint)fVar71 |
                            (uint)fVar84 & -(uint)(fVar71 < fVar84));
            txfm_param_2.eob =
                 ~-(uint)(fVar80 < fVar85) & (uint)fVar80 | -(uint)(fVar80 < fVar85) & (uint)fVar85;
            uVar33 = uVar59;
            if (fVar85 > fVar80) {
              uVar33 = uVar63;
              uVar63 = uVar59;
            }
            uVar67 = ~-(uint)(fVar73 < (float)txfm_param_2._16_4_) & (uint)fVar73 |
                     -(uint)(fVar73 < (float)txfm_param_2._16_4_) & txfm_param_2._16_4_;
            uVar59 = (uint)local_668;
            if (fVar73 < (float)txfm_param_2._16_4_) {
              uVar59 = (uint)dist;
              txfm_param_2._16_4_ = fVar73;
              dist._0_4_ = (uint)local_668;
            }
            uVar60 = uVar66;
            if (fVar79 < fVar76) {
              uVar60 = uVar41;
              uVar41 = uVar66;
            }
            fVar80 = (float)(~-(uint)(fVar71 < (float)txfm_param_2.eob) & (uint)fVar71 |
                            -(uint)(fVar71 < (float)txfm_param_2.eob) & txfm_param_2.eob);
            uVar66 = uVar63;
            if (fVar71 < (float)txfm_param_2.eob) {
              uVar66 = uVar34;
              txfm_param_2.eob = (int)fVar71;
              uVar34 = uVar63;
            }
            fVar76 = (float)(~-(uint)(fVar79 < fVar76) & (uint)fVar79 |
                            (uint)fVar76 & -(uint)(fVar79 < fVar76));
            fVar71 = fVar86;
            if (fVar88 <= fVar86) {
              fVar71 = fVar88;
            }
            fVar73 = (float)(~-(uint)(fVar86 < fVar88) & (uint)fVar86 |
                            -(uint)(fVar86 < fVar88) & (uint)fVar88);
            uVar63 = uVar33;
            if (fVar88 > fVar86) {
              uVar63 = uVar81;
              uVar81 = uVar33;
            }
            bVar65 = fVar80 < (float)txfm_param_2._16_4_;
            uVar78 = -(uint)bVar65 & txfm_param_2._16_4_;
            uVar33 = uVar59;
            if (fVar80 < (float)txfm_param_2._16_4_) {
              uVar33 = uVar34;
              txfm_param_2._16_4_ = fVar80;
              uVar34 = uVar59;
            }
            txfm_param_2.lossless = uVar78 | ~-(uint)bVar65 & (uint)fVar80;
            txfm_param_2.tx_type = (char)uVar67;
            txfm_param_2.tx_size = (char)(uVar67 >> 8);
            txfm_param_2._2_2_ = (short)(uVar67 >> 0x10);
            dist = CONCAT44(uVar34,(uint)dist);
            fVar86 = (float)(~-(uint)(fVar76 < fVar71) & (uint)fVar76 |
                            -(uint)(fVar76 < fVar71) & (uint)fVar71);
            uVar34 = uVar63;
            if (fVar76 < fVar71) {
              uVar34 = uVar41;
              uVar41 = uVar63;
            }
            uStack_660 = CONCAT44(uVar60,uVar34);
            bVar65 = fVar73 < (float)txfm_param_2._16_4_;
            uVar59 = -(uint)bVar65 & txfm_param_2._16_4_;
            uVar34 = uVar33;
            if (fVar73 < (float)txfm_param_2._16_4_) {
              uVar34 = uVar81;
              txfm_param_2._16_4_ = fVar73;
              uVar81 = uVar33;
            }
            fVar71 = (float)(-(uint)(fVar86 < (float)txfm_param_2.eob) & txfm_param_2.eob |
                            ~-(uint)(fVar86 < (float)txfm_param_2.eob) & (uint)fVar86);
            uVar33 = uVar66;
            if (fVar86 < (float)txfm_param_2.eob) {
              uVar33 = uVar41;
              txfm_param_2.eob = (int)fVar86;
              uVar41 = uVar66;
            }
            bVar64 = fVar71 < (float)txfm_param_2._16_4_;
            uVar66 = -(uint)bVar64 & txfm_param_2._16_4_;
            uVar63 = uVar34;
            if (fVar71 < (float)txfm_param_2._16_4_) {
              uVar63 = uVar41;
              txfm_param_2._16_4_ = fVar71;
              uVar41 = uVar34;
            }
            txfm_param_2.is_hbd = ~-(uint)bVar64 & (uint)fVar71 | uVar66;
            txfm_param_2.bd = ~-(uint)bVar65 & (uint)fVar73 | uVar59;
            uStack_670 = CONCAT44(uVar41,uVar81);
            local_668 = CONCAT44(uVar33,uVar63);
          }
          else {
            local_568 = ZEXT416(0xbf800000);
            uVar33 = (uint)uStack_670;
            fVar84 = fVar73;
            if (fVar69 < fVar73) {
              uVar33 = (uint)dist;
              fVar84 = fVar69;
              dist._0_4_ = (uint)uStack_670;
            }
            local_6e0 = uVar59;
            fVar79 = fVar76;
            if (fVar71 < fVar76) {
              local_6e0 = uVar34;
              uVar34 = uVar59;
              fVar79 = fVar71;
            }
            uVar59 = (uint)uStack_660;
            if (fVar88 < -1.0) {
              uVar59 = (uint)local_668;
              fVar80 = fVar88;
              local_668._0_4_ = (uint)uStack_660;
            }
            local_538 = (NN_CONFIG *)(ulong)(uint)fVar86;
            uVar41 = uVar63;
            if (-1.0 <= fVar86) {
              local_538 = (NN_CONFIG *)0xbf800000;
              uVar41 = uStack_660._4_4_;
              uStack_660._4_4_ = uVar63;
            }
            local_448 = 0xbf800000;
            uStack_444 = 0;
            uStack_440 = 0;
            uStack_43c = 0;
            fVar85 = (float)(~-(uint)(fVar71 < fVar76) & (uint)fVar71 |
                            (uint)fVar76 & -(uint)(fVar71 < fVar76));
            fVar76 = (float)(~-(uint)(fVar86 < -1.0) & (uint)fVar86 |
                            -(uint)(fVar86 < -1.0) & 0xbf800000);
            fVar71 = fVar85;
            if (fVar84 <= fVar85) {
              fVar71 = fVar84;
            }
            fVar86 = (float)(~uVar66 & (uint)fVar69 | uVar66 & (uint)fVar73);
            uVar63 = uVar33;
            if (fVar84 > fVar85) {
              uVar63 = uVar34;
              uVar34 = uVar33;
            }
            fVar88 = (float)(~-(uint)(fVar88 < -1.0) & (uint)fVar88 |
                            -(uint)(fVar88 < -1.0) & 0xbf800000);
            uVar66 = uVar59;
            fVar73 = fVar80;
            if (fVar76 < fVar80) {
              uVar66 = uStack_660._4_4_;
              uStack_660._4_4_ = uVar59;
              fVar73 = fVar76;
            }
            local_5e8 = (int16_t *)(ulong)(uint)fVar86;
            uStack_5e0 = 0;
            if (fVar88 <= fVar86) {
              local_5e8 = (int16_t *)(ulong)(uint)fVar88;
              uStack_5e0 = 0;
            }
            uStack_5e0 = 0;
            uVar59 = (uint)local_668;
            if (fVar88 > fVar86) {
              uVar59 = (uint)dist;
              dist._0_4_ = (uint)local_668;
            }
            local_748 = (NN_CONFIG *)(ulong)(uint)fVar79;
            if (local_538._0_4_ <= fVar79) {
              local_748 = local_538;
            }
            uStack_73c = 0;
            uStack_740 = 0;
            uVar33 = uVar41;
            if (local_538._0_4_ > fVar79) {
              uVar33 = local_6e0;
              local_6e0 = uVar41;
            }
            fVar69 = (float)(~-(uint)(fVar85 < fVar84) & (uint)fVar85 |
                            (uint)fVar84 & -(uint)(fVar85 < fVar84));
            fVar80 = (float)(~-(uint)(fVar76 < fVar80) & (uint)fVar76 |
                            (uint)fVar80 & -(uint)(fVar76 < fVar80));
            local_5f8 = 0xbf800000;
            uStack_5f0 = 0;
            local_7c8 = local_568._0_8_;
            local_5f8 = local_7c8;
            uStack_5f0 = 0;
            uStack_5f0 = 0;
            fVar76 = fVar69;
            if (fVar80 <= fVar69) {
              fVar76 = fVar80;
            }
            local_7a8 = ZEXT416((uint)fVar76);
            uVar41 = uStack_660._4_4_;
            if (fVar80 > fVar69) {
              uVar41 = uVar34;
              uVar34 = uStack_660._4_4_;
            }
            fVar84 = fVar71;
            if (fVar73 <= fVar71) {
              fVar84 = fVar73;
            }
            fVar86 = (float)(~-(uint)(fVar86 < fVar88) & (uint)fVar86 |
                            -(uint)(fVar86 < fVar88) & (uint)fVar88);
            uVar81 = uVar66;
            if (fVar73 > fVar71) {
              uVar81 = uVar63;
              uVar63 = uVar66;
            }
            uStack_5b0 = 0;
            fStack_5ac = 0.0;
            uStack_5b0 = 0;
            fStack_5ac = 0.0;
            fStack_5ac = 0.0;
            uStack_5b0 = 0;
            local_5b8 = (int16_t *)0xbf800000;
            bVar65 = -1.0 <= fVar86;
            uVar66 = ~-(uint)(fVar86 < -1.0) & (uint)fVar86 | -(uint)(fVar86 < -1.0) & 0xbf800000;
            if (bVar65) {
              fVar86 = -1.0;
            }
            uVar67 = (uint)dist;
            if (!bVar65) {
              uVar67 = (uint)local_658;
            }
            fVar80 = (float)(~-(uint)(fVar69 < fVar80) & (uint)fVar69 |
                            -(uint)(fVar69 < fVar80) & (uint)fVar80);
            if (!bVar65) {
              local_658._0_4_ = (uint)dist;
            }
            uVar60 = uVar33;
            if ((float)local_748 < -1.0) {
              uVar60 = uStack_640._4_4_;
            }
            fVar88 = (float)(~-(uint)(fVar79 < local_538._0_4_) & (uint)fVar79 |
                            (uint)local_538._0_4_ & -(uint)(fVar79 < local_538._0_4_));
            if ((float)local_748 < -1.0) {
              uStack_640._4_4_ = uVar33;
            }
            fVar69 = fVar80;
            if (local_5e8._0_4_ <= fVar80) {
              fVar69 = local_5e8._0_4_;
            }
            uVar33 = uVar59;
            if (local_5e8._0_4_ > fVar80) {
              uVar33 = uVar34;
              uVar34 = uVar59;
            }
            fVar79 = fVar88;
            if (fVar84 <= fVar88) {
              fVar79 = fVar84;
            }
            local_718 = ZEXT416((uint)fVar79);
            uVar78 = uVar81;
            uVar59 = local_6e0;
            if (fVar84 > fVar88) {
              uVar78 = local_6e0;
              uVar59 = uVar81;
            }
            fVar73 = (float)(~-(uint)(fVar71 < fVar73) & (uint)fVar71 |
                            (uint)fVar73 & -(uint)(fVar71 < fVar73));
            uStack_72c = 0;
            uStack_730 = 0;
            fVar88 = (float)(~-(uint)(fVar88 < fVar84) & (uint)fVar88 |
                            (uint)fVar84 & -(uint)(fVar88 < fVar84));
            fVar71 = fVar73;
            if (fVar69 <= fVar73) {
              fVar71 = fVar69;
            }
            uVar81 = uVar33;
            if (fVar69 > fVar73) {
              uVar81 = uVar63;
              uVar63 = uVar33;
            }
            local_6d8 = ZEXT416((uint)fVar88);
            if (fVar76 <= fVar88) {
              local_6d8 = local_7a8;
            }
            uVar33 = uVar41;
            if (fVar76 > fVar88) {
              uVar33 = uVar59;
              uVar59 = uVar41;
            }
            fVar84 = (float)(~-(uint)(fVar80 < local_5e8._0_4_) & (uint)fVar80 |
                            (uint)local_5e8._0_4_ & -(uint)(fVar80 < local_5e8._0_4_));
            fVar80 = fVar84;
            if (-1.0 <= fVar84) {
              fVar80 = -1.0;
            }
            local_708 = ZEXT416((uint)fVar80);
            fVar76 = (float)(~-(uint)(fVar88 < fVar76) & (uint)fVar88 |
                            (uint)fVar76 & -(uint)(fVar88 < fVar76));
            uVar41 = local_658._4_4_;
            if (-1.0 > fVar84) {
              uVar41 = uVar34;
              uVar34 = local_658._4_4_;
            }
            fVar88 = fVar79;
            if (-1.0 <= fVar79) {
              fVar88 = -1.0;
            }
            uVar42 = (uint)uStack_640;
            if (-1.0 > fVar79) {
              uVar42 = uVar78;
              uVar78 = (uint)uStack_640;
            }
            fVar85 = (float)(~-(uint)(fVar84 < -1.0) & (uint)fVar84 |
                            -(uint)(fVar84 < -1.0) & 0xbf800000);
            fVar84 = fVar76;
            if (fVar71 <= fVar76) {
              fVar84 = fVar71;
            }
            uVar53 = uVar81;
            if (fVar71 > fVar76) {
              uVar53 = uVar59;
              uVar59 = uVar81;
            }
            local_6c8 = (tran_low_t **)0xbf800000;
            uStack_6bc = 0;
            uStack_6c0 = 0;
            fVar69 = (float)(~-(uint)(fVar73 < fVar69) & (uint)fVar73 |
                            (uint)fVar69 & -(uint)(fVar73 < fVar69));
            fVar73 = fVar85;
            if (fVar86 <= fVar85) {
              fVar73 = fVar86;
            }
            uVar81 = (uint)local_658;
            if (fVar86 > fVar85) {
              uVar81 = uVar34;
              uVar34 = (uint)local_658;
            }
            txfm_param_2.lossless =
                 -(uint)(fVar85 < fVar86) & (uint)fVar86 | ~-(uint)(fVar85 < fVar86) & (uint)fVar85;
            txfm_param_2.tx_type = (char)uVar66;
            txfm_param_2.tx_size = (char)(uVar66 >> 8);
            txfm_param_2._2_2_ = (short)(uVar66 >> 0x10);
            dist = CONCAT44(uVar34,uVar67);
            fVar86 = fVar69;
            if (-1.0 <= fVar69) {
              fVar86 = -1.0;
            }
            fVar85 = (float)(~-(uint)((float)local_748 < -1.0) & (uint)(float)local_748 |
                            -(uint)((float)local_748 < -1.0) & 0xbf800000);
            uVar34 = (uint)uStack_650;
            if (-1.0 > fVar69) {
              uVar34 = uVar63;
              uVar63 = (uint)uStack_650;
            }
            fVar82 = (float)local_6d8._0_4_;
            if (-1.0 <= (float)local_6d8._0_4_) {
              fVar82 = -1.0;
            }
            fVar71 = (float)(~-(uint)(fVar76 < fVar71) & (uint)fVar76 |
                            (uint)fVar71 & -(uint)(fVar76 < fVar71));
            uVar66 = local_648._4_4_;
            if (-1.0 > (float)local_6d8._0_4_) {
              uVar66 = uVar33;
              uVar33 = local_648._4_4_;
            }
            fVar76 = (float)(~-(uint)(fVar69 < -1.0) & (uint)fVar69 |
                            -(uint)(fVar69 < -1.0) & 0xbf800000);
            local_6c8._0_4_ = -1.0;
            uVar67 = uVar42;
            if (fVar85 < fVar88) {
              uVar67 = uVar60;
              uVar60 = uVar42;
            }
            uStack_640 = CONCAT44(uStack_640._4_4_,uVar67);
            fVar69 = fVar71;
            if (-1.0 <= fVar71) {
              fVar69 = -1.0;
            }
            uVar67 = uStack_650._4_4_;
            if (-1.0 > fVar71) {
              uVar67 = uVar59;
              uVar59 = uStack_650._4_4_;
            }
            bVar65 = fVar73 <= fVar76;
            fVar75 = fVar76;
            if (bVar65) {
              fVar75 = fVar73;
            }
            fVar88 = (float)(~-(uint)(fVar85 < fVar88) & (uint)fVar85 |
                            (uint)fVar88 & -(uint)(fVar85 < fVar88));
            uVar42 = uVar63;
            if (!bVar65) {
              uVar42 = uVar81;
            }
            fVar71 = (float)(~-(uint)(fVar71 < -1.0) & (uint)fVar71 |
                            -(uint)(fVar71 < -1.0) & 0xbf800000);
            if (!bVar65) {
              uVar81 = uVar63;
            }
            fVar85 = fVar84;
            if (-1.0 <= fVar84) {
              fVar85 = local_6c8._0_4_;
            }
            uVar63 = (uint)local_648;
            if (-1.0 > fVar84) {
              uVar63 = uVar53;
              uVar53 = (uint)local_648;
            }
            fVar70 = (float)(~-(uint)((float)local_6d8._0_4_ < -1.0) & local_6d8._0_4_ |
                            -(uint)((float)local_6d8._0_4_ < -1.0) & 0xbf800000);
            uVar10 = uVar66;
            if (fVar88 < fVar82) {
              uVar10 = uVar60;
              uVar60 = uVar66;
            }
            fVar77 = (float)(-(uint)(fVar71 < fVar86) & (uint)fVar86 |
                            ~-(uint)(fVar71 < fVar86) & (uint)fVar71);
            fVar74 = fVar71;
            if (fVar86 <= fVar71) {
              fVar74 = fVar86;
            }
            uVar66 = uVar34;
            if (fVar86 > fVar71) {
              uVar66 = uVar59;
              uVar59 = uVar34;
            }
            fVar71 = fVar70;
            if (fVar85 <= fVar70) {
              fVar71 = fVar85;
            }
            fVar86 = (float)(~-(uint)(fVar79 < -1.0) & (uint)fVar79 |
                            -(uint)(fVar79 < -1.0) & 0xbf800000);
            uVar34 = uVar63;
            if (fVar85 > fVar70) {
              uVar34 = uVar33;
              uVar33 = uVar63;
            }
            fVar83 = (float)(-(uint)(fVar77 < fVar80) & (uint)fVar80 |
                            ~-(uint)(fVar77 < fVar80) & (uint)fVar77);
            fVar79 = fVar77;
            if (fVar80 <= fVar77) {
              fVar79 = fVar80;
            }
            uVar63 = uVar41;
            if (fVar80 > fVar77) {
              uVar63 = uVar59;
              uVar59 = uVar41;
            }
            fVar80 = fVar86;
            if (fVar71 <= fVar86) {
              fVar80 = fVar71;
            }
            fVar88 = (float)(~-(uint)(fVar88 < fVar82) & (uint)fVar88 |
                            (uint)fVar82 & -(uint)(fVar88 < fVar82));
            uVar41 = uVar34;
            if (fVar71 > fVar86) {
              uVar41 = uVar78;
              uVar78 = uVar34;
            }
            fVar82 = fVar83;
            if (fVar75 <= fVar83) {
              fVar82 = fVar75;
            }
            fVar85 = (float)(~-(uint)(fVar70 < fVar85) & (uint)fVar70 |
                            (uint)fVar85 & -(uint)(fVar70 < fVar85));
            uVar34 = uVar81;
            if (fVar75 > fVar83) {
              uVar34 = uVar59;
              uVar59 = uVar81;
            }
            txfm_param_2.is_hbd =
                 -(uint)(fVar83 < fVar75) & (uint)fVar75 | ~-(uint)(fVar83 < fVar75) & (uint)fVar83;
            txfm_param_2.bd =
                 ~-(uint)(fVar76 < fVar73) & (uint)fVar76 | -(uint)(fVar76 < fVar73) & (uint)fVar73;
            uStack_670 = CONCAT44(uVar59,uVar42);
            fVar71 = (float)(~-(uint)(fVar86 < fVar71) & (uint)fVar86 |
                            (uint)fVar71 & -(uint)(fVar86 < fVar71));
            uVar59 = uVar41;
            if (fVar88 < fVar80) {
              uVar59 = uVar60;
              uVar60 = uVar41;
            }
            fVar86 = (float)(~-(uint)(fVar84 < -1.0) & (uint)fVar84 |
                            -(uint)(fVar84 < -1.0) & 0xbf800000);
            local_648 = CONCAT44(uVar10,uVar59);
            fVar76 = fVar85;
            if (fVar79 <= fVar85) {
              fVar76 = fVar79;
            }
            uVar59 = uVar63;
            if (fVar79 > fVar85) {
              uVar59 = uVar33;
              uVar33 = uVar63;
            }
            fVar88 = (float)(~-(uint)(fVar88 < fVar80) & (uint)fVar88 |
                            (uint)fVar80 & -(uint)(fVar88 < fVar80));
            fVar80 = fVar71;
            if (fVar74 <= fVar71) {
              fVar80 = fVar74;
            }
            fVar73 = (float)(~-(uint)(fVar85 < fVar79) & (uint)fVar85 |
                            (uint)fVar79 & -(uint)(fVar85 < fVar79));
            uVar63 = uVar66;
            if (fVar74 > fVar71) {
              uVar63 = uVar78;
              uVar78 = uVar66;
            }
            fVar84 = fVar86;
            if (fVar82 <= fVar86) {
              fVar84 = fVar82;
            }
            uVar66 = uVar34;
            if (fVar82 > fVar86) {
              uVar66 = uVar53;
              uVar53 = uVar34;
            }
            fVar79 = (float)(-(uint)(fVar88 < fVar69) & (uint)fVar69 |
                            ~-(uint)(fVar88 < fVar69) & (uint)fVar88);
            fVar71 = (float)(~-(uint)(fVar71 < fVar74) & (uint)fVar71 |
                            (uint)fVar74 & -(uint)(fVar71 < fVar74));
            uVar34 = uVar67;
            if (fVar88 < fVar69) {
              uVar34 = uVar60;
              uVar60 = uVar67;
            }
            bVar65 = fVar73 < fVar84;
            uVar81 = -(uint)bVar65 & (uint)fVar84;
            uVar41 = uVar66;
            if (fVar73 < fVar84) {
              uVar41 = uVar33;
              fVar84 = fVar73;
              uVar33 = uVar66;
            }
            txfm_param_2.eob = ~-(uint)bVar65 & (uint)fVar73 | uVar81;
            txfm_param_2._16_4_ =
                 ~-(uint)(fVar86 < fVar82) & (uint)fVar86 | -(uint)(fVar86 < fVar82) & (uint)fVar82;
            local_668 = CONCAT44(uVar33,uVar53);
            fVar86 = (float)(-(uint)(fVar79 < fVar80) & (uint)fVar80 |
                            ~-(uint)(fVar79 < fVar80) & (uint)fVar79);
            uVar66 = uVar63;
            if (fVar79 < fVar80) {
              uVar66 = uVar60;
              uVar60 = uVar63;
            }
            uStack_650 = CONCAT44(uVar34,uVar66);
            uVar34 = uVar41;
            if (fVar71 < fVar84) {
              uVar34 = uVar78;
              fVar84 = fVar71;
              uVar78 = uVar41;
            }
            uVar63 = uVar59;
            if (fVar86 < fVar76) {
              uVar63 = uVar60;
              uVar60 = uVar59;
            }
            uVar59 = uVar34;
            if ((float)(-(uint)(fVar86 < fVar76) & (uint)fVar76 |
                       ~-(uint)(fVar86 < fVar76) & (uint)fVar86) < fVar84) {
              uVar59 = uVar60;
              uVar60 = uVar34;
            }
            uStack_660 = CONCAT44(uVar60,uVar78);
            local_658 = CONCAT44(uVar63,uVar59);
          }
          uVar37 = (ulong)uVar63;
          piVar45 = &dist;
          uVar34 = uVar35;
          if ((uVar23 & 0xfc) != 0) {
            uVar46 = 0;
            uVar30 = (ulong)uVar36;
            if ((int)uVar36 < 1) {
              uVar30 = uVar46;
            }
            fVar71 = 0.0;
            fVar76 = 0.0;
            while ((uVar51 = uVar30, uVar30 != uVar46 &&
                   (((uVar46 & 0xfffffffe) == 0 || (uVar51 = uVar46, fVar76 <= 30.0))))) {
              fVar71 = fVar71 + *(float *)(&txfm_param_2.tx_type + uVar46 * 4);
              uVar46 = uVar46 + 1;
              fVar76 = (100.0 / fVar87) * fVar71;
            }
            for (; (long)uVar51 < lVar47; uVar51 = uVar51 + 1) {
              lVar50 = uVar51 * 4;
              uVar34 = uVar34 & ~(1 << (*(byte *)((long)&dist + lVar50) & 0x1f));
            }
          }
        }
        txk_map._0_8_ = *piVar45;
        txk_map._8_8_ = piVar45[1];
        txk_map._16_8_ = piVar45[2];
        txk_map._24_8_ = piVar45[3];
        txk_map._32_8_ = piVar45[4];
        txk_map._40_8_ = piVar45[5];
        txk_map._48_8_ = piVar45[6];
        txk_map._56_8_ = piVar45[7];
      }
    }
    else {
      iVar62 = (x->txfm_search_params).prune_2d_txfm_mode;
      local_738 = (NN_CONFIG *)(long)prune_factors[iVar62];
      if (uVar35 < 8) {
        iVar20 = 0;
        av1_setup_xform(cm,x,tx_size,'\0',&txfm_param);
        av1_setup_quant(tx_size,1,1,(cpi->oxcf).q_cfg.quant_b_adapt,(QUANT_PARAM *)&visible_cols);
        iVar62 = 0xf;
        uVar36 = 0;
        while( true ) {
          lVar47 = (long)iVar20;
          if (uVar36 == 0x10) break;
          dist = 0;
          if ((uVar34 >> (uVar36 & 0x1f) & 1) == 0) {
            txk_map[iVar62] = uVar36;
            iVar62 = iVar62 + -1;
          }
          else {
            TVar40 = (TX_TYPE)uVar36;
            txfm_param.tx_type = TVar40;
            av1_setup_qmatrix(&(cpi->common).quant_params,local_6f8,plane,tx_size,TVar40,
                              (QUANT_PARAM *)&visible_cols);
            av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param,
                            (QUANT_PARAM *)&visible_cols);
            iVar21 = av1_cost_coeffs_txb_laplacian
                               (x,plane,block,tx_size,TVar40,txb_ctx,(uint)_Var18,0);
            dist_block_tx_domain
                      (x,plane,block,tx_size,(qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630),
                       av1_scan_orders[(ulong)txfm_param._0_8_ >> 8 & 0xff][txfm_param._0_8_ & 0xff]
                       .scan,&dist,(int64_t *)&txfm_param_2);
            txk_map[lVar47] = uVar36;
            lVar50 = (long)x->rdmult * (long)iVar21 + 0x100 >> 9;
            *(ulong *)(&quant_param.log_scale + lVar47 * 2) =
                 dist * 0x80 + lVar50 + (ulong)(lVar50 + dist * 0x80 == 0);
            iVar20 = iVar20 + 1;
          }
          uVar36 = uVar36 + 1;
        }
        if (iVar20 == 0) {
          uVar36 = 0;
        }
        else {
          sort_rd((int64_t *)&quant_param,txk_map,iVar20);
          uVar36 = -2 << ((byte)txk_map[0] & 0x1f) | 0xfffffffeU >> 0x20 - ((byte)txk_map[0] & 0x1f)
          ;
          lVar50 = 1;
          while ((lVar50 < lVar47 &&
                 (((*(long *)(&quant_param.log_scale + lVar50 * 2) -
                   CONCAT44(quant_param._4_4_,quant_param.log_scale)) * 1000) /
                  CONCAT44(quant_param._4_4_,quant_param.log_scale) < (long)local_738))) {
            uVar36 = uVar36 & ~(1 << (*(byte *)(txk_map + lVar50) & 0x1f));
            lVar50 = lVar50 + 1;
          }
          uVar36 = ~uVar36;
        }
      }
      else {
        iVar20 = 0xf;
        iVar62 = mul_factors[iVar62];
        idx_v[0] = 0;
        idx_v[1] = 1;
        idx_v[2] = 2;
        idx_v[3] = 3;
        idx_h[0] = 0;
        idx_h[1] = 1;
        idx_h[2] = 2;
        idx_h[3] = 3;
        skip_v[0] = 0;
        skip_v[1] = 0;
        skip_v[2] = 0;
        skip_v[3] = 0;
        skip_h[0] = 0;
        skip_h[1] = 0;
        skip_h[2] = 0;
        skip_h[3] = 0;
        av1_setup_xform(cm,x,tx_size,'\0',&txfm_param_2);
        av1_setup_quant(tx_size,1,1,(cpi->oxcf).q_cfg.quant_b_adapt,(QUANT_PARAM *)&visible_cols);
        txfm_param_2.tx_set_type = '\x05';
        dist_1 = 0;
        pCVar1 = &(cpi->common).quant_params;
        for (lVar47 = 0; lVar47 != 0x10; lVar47 = lVar47 + 4) {
          TVar40 = *(TX_TYPE *)((long)&prune_tx_2D_tx_type_table_2D + lVar47);
          txfm_param_2.tx_type = TVar40;
          av1_setup_qmatrix(pCVar1,local_6f8,plane,tx_size,TVar40,(QUANT_PARAM *)&visible_cols);
          av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param_2,
                          (QUANT_PARAM *)&visible_cols);
          dist_block_tx_domain
                    (x,plane,block,tx_size,(qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630),
                     av1_scan_orders[(ulong)txfm_param_2._0_8_ >> 8 & 0xff]
                     [txfm_param_2._0_8_ & 0xff].scan,&dist_1,&local_450);
          iVar21 = av1_cost_coeffs_txb_laplacian
                             (x,plane,block,tx_size,TVar40,txb_ctx,(uint)_Var18,0);
          lVar50 = dist_1 * 0x80 + ((long)x->rdmult * (long)iVar21 + 0x100 >> 9);
          *(long *)((long)&dist + lVar47 * 2) = lVar50;
          if (ref_best_rd < lVar50 - (lVar50 >> 2)) {
            *(undefined4 *)((long)skip_h + lVar47) = 1;
          }
        }
        sort_rd(&dist,idx_h,4);
        for (lVar47 = 1; lVar47 != 4; lVar47 = lVar47 + 1) {
          if ((double)dist * 1.2 < (double)(&dist)[lVar47]) {
            skip_h[idx_h[lVar47]] = 1;
          }
        }
        iVar62 = (int)(uVar35 * iVar62 + 0x32) / 100;
        lVar47 = (long)idx_h[0];
        if (skip_h[lVar47] == 0) {
          txfm_param.tx_type = (undefined1)dist;
          txfm_param.tx_size = dist._1_1_;
          txfm_param._2_2_ = dist._2_2_;
          txfm_param.lossless = dist._4_4_;
          lVar50 = 0;
          while( true ) {
            if (lVar50 == 0xc) break;
            TVar40 = *(TX_TYPE *)
                      (&prune_tx_2D_tx_type_table_2D +
                      lVar47 + (long)*(int *)((long)idx_v + lVar50 + 4) * 4);
            txfm_param_2.tx_type = TVar40;
            av1_setup_qmatrix(pCVar1,local_6f8,plane,tx_size,TVar40,(QUANT_PARAM *)&visible_cols);
            av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param_2,
                            (QUANT_PARAM *)&visible_cols);
            dist_block_tx_domain
                      (x,plane,block,tx_size,(qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630),
                       av1_scan_orders[(ulong)txfm_param_2._0_8_ >> 8 & 0xff]
                       [txfm_param_2._0_8_ & 0xff].scan,&dist_1,&local_450);
            iVar21 = av1_cost_coeffs_txb_laplacian
                               (x,plane,block,tx_size,TVar40,txb_ctx,(uint)_Var18,0);
            lVar39 = dist_1 * 0x80 + ((long)x->rdmult * (long)iVar21 + 0x100 >> 9);
            *(long *)((long)&txfm_param.bd + lVar50 * 2) = lVar39;
            if (ref_best_rd < lVar39 - (lVar39 >> 2)) {
              *(undefined4 *)((long)skip_v + lVar50 + 4) = 1;
            }
            lVar50 = lVar50 + 4;
          }
          sort_rd((int64_t *)&txfm_param,idx_v,4);
          for (lVar47 = 1; lVar47 != 4; lVar47 = lVar47 + 1) {
            if ((double)(long)txfm_param._0_8_ * 1.2 <
                (double)*(long *)(&txfm_param.tx_type + lVar47 * 8)) {
              skip_v[idx_v[lVar47]] = 1;
            }
          }
          iVar21 = 0;
          for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 4) {
            iVar22 = *(int *)((long)&DAT_004646b0 + lVar47);
            iVar4 = *(int *)((long)&DAT_004646f0 + lVar47);
            uVar36 = (&prune_tx_2D_tx_type_table_2D)[(long)idx_h[iVar4] + (long)idx_v[iVar22] * 4];
            if (((((uint)(int)(short)uVar34 >> (uVar36 & 0x1f) & 1) == 0) ||
                (skip_h[idx_h[iVar4]] != 0)) || (skip_v[idx_v[iVar22]] != 0)) {
              txk_map[iVar20] = uVar36;
              iVar20 = iVar20 + -1;
            }
            else {
              txk_map[iVar21] = uVar36;
              *(ulong *)(&quant_param.log_scale + (long)iVar21 * 2) =
                   (&dist)[iVar4] + *(long *)(&txfm_param.tx_type + (long)iVar22 * 8) +
                   (ulong)((&dist)[iVar4] + *(long *)(&txfm_param.tx_type + (long)iVar22 * 8) == 0);
              iVar21 = iVar21 + 1;
            }
          }
          sort_rd((int64_t *)&quant_param,txk_map,iVar21);
          uVar36 = -2 << ((byte)txk_map[0] & 0x1f) | 0xfffffffeU >> 0x20 - ((byte)txk_map[0] & 0x1f)
          ;
          if (iVar21 < iVar62) {
            iVar62 = iVar21;
          }
          lVar47 = 1;
          while ((lVar47 < iVar62 &&
                 (((*(long *)(&quant_param.log_scale + lVar47 * 2) -
                   CONCAT44(quant_param._4_4_,quant_param.log_scale)) * 0x708) /
                  CONCAT44(quant_param._4_4_,quant_param.log_scale) < (long)local_738))) {
            uVar36 = uVar36 & ~(1 << (*(byte *)(txk_map + lVar47) & 0x1f));
            lVar47 = lVar47 + 1;
          }
          uVar36 = ~uVar36;
        }
        else {
          uVar36 = 0;
        }
      }
      uVar34 = uVar36 & uVar34;
      uVar37 = (ulong)uVar34;
    }
  }
  else {
    uVar34 = uVar34 & 0xc01;
  }
  if ((short)uVar34 == 0) {
    bVar31 = bVar17;
    uVar34 = 1 << (bVar17 & 0x1f);
  }
  bVar65 = 0xf < bVar31;
  uVar52 = (undefined7)(uVar37 >> 8);
LAB_0021a7b6:
  cVar15 = (char)local_720;
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    bVar31 = (char)(x->e_mbd).bd * '\x02' - 0x10;
    uVar36 = (uint)(1 << (bVar31 & 0x1f)) >> 1;
    uVar25 = (long)(uVar25 + uVar36) >> (bVar31 & 0x3f);
    block_mse_q8 = uVar36 + block_mse_q8 >> (bVar31 & 0x1f);
  }
  uVar36 = (x->txfm_search_params).use_transform_domain_distortion;
  lVar47 = (long)(int)local_6e8;
  bVar64 = (ulong)block_mse_q8 <=
           lVar47 * lVar47 * (ulong)(x->txfm_search_params).coeff_opt_thresholds[0];
  cVar32 = (char)local_75c;
  if (((uVar36 == 0) || (block_mse_q8 < (x->txfm_search_params).tx_domain_dist_threshold)) ||
     ((0x61810UL >> (uVar38 & 0x3f) & 1) != 0)) {
    auVar12._12_4_ = 0;
    auVar12._0_12_ = local_718._4_12_;
    local_718 = auVar12 << 0x20;
    local_748 = (NN_CONFIG *)((ulong)local_748._4_4_ << 0x20);
  }
  else if (cVar32 == '\x01' && uVar36 == 1) {
    if (x->rd_model == '\x01') {
      local_748 = (NN_CONFIG *)CONCAT44(local_748._4_4_,0x61801);
      auVar11._12_4_ = 0;
      auVar11._0_12_ = local_718._4_12_;
      local_718 = auVar11 << 0x20;
    }
    else {
      local_718._0_4_ = (undefined4)CONCAT71(uVar52,bVar65 & (short)uVar34 != 1);
      local_748 = (NN_CONFIG *)CONCAT44(local_748._4_4_,local_718._0_4_);
    }
  }
  else {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = local_718._4_12_;
    local_718 = auVar14 << 0x20;
    local_748 = (NN_CONFIG *)CONCAT44(local_748._4_4_,local_75c);
  }
  pqVar55 = (qm_val_t *)(uVar25 * 0x10);
  local_738 = (NN_CONFIG *)local_728->eobs;
  lVar39 = 0;
  av1_setup_xform(cm,x,tx_size,'\0',&txfm_param);
  av1_setup_quant(tx_size,(uint)((cVar15 == '\0' && skip_trellis == 0) && bVar64),
                  (uint)((cVar15 != '\0' || skip_trellis != 0) || !bVar64),
                  (cpi->oxcf).q_cfg.quant_b_adapt,&quant_param);
  pqVar28 = (qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630);
  pCVar1 = &(cpi->common).quant_params;
  local_6c8 = &x->plane[plane].coeff;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_708._8_8_;
  local_708 = auVar13 << 0x40;
  uVar36 = 0;
  uVar30 = 0;
  lVar50 = 0x7fffffffffffffff;
  xd_00 = local_6f8;
  do {
    TVar40 = (TX_TYPE)uVar36;
    if (lVar39 == 0x10) {
LAB_0021b021:
      uVar43 = (uint16_t)uVar30;
      best_rd_stats->skip_txfm = uVar43 == 0;
      local_630 = pqVar28;
      if (plane == 0) {
        update_txk_array(xd_00,blk_row,blk_col,tx_size,TVar40);
      }
      local_728->txb_entropy_ctx[local_6f0] = local_708[0];
      local_728->eobs[local_6f0] = uVar43;
      local_728->dqcoeff = local_550;
      if ((local_718[0] & uVar43 != 0) == 1) {
        iVar29 = dist_block_px_domain(cpi,x,plane,plane_bsize,block,blk_row,blk_col,tx_size);
        best_rd_stats->dist = iVar29;
        best_rd_stats->sse = (int64_t)pqVar55;
      }
      pMVar8 = *(x->e_mbd).mi;
      if (((((pMVar8->field_0xa7 & 0x80) == 0) && (uVar43 != 0)) && (pMVar8->ref_frame[0] < '\x01'))
         && ((tx_size_high_unit[uVar38] + blk_row < (int)(uint)pTVar24[0x2ed56].tx_set_type ||
             (tx_size_wide_unit[uVar38] + blk_col < (int)(uint)pTVar24[0x2ed58].tx_type)))) {
        uVar3 = x->plane[plane].eobs[local_6f0];
        if (uVar3 != 0) {
          ptVar7 = x->plane[plane].dqcoeff;
          _Var18 = (cpi->common).features.reduced_tx_set_used;
          local_6e8 = (ulong)uVar3;
          bVar31 = av1_get_tx_size(plane,xd_00);
          local_720 = CONCAT44(local_720._4_4_,(uint)bVar31);
          tx_type = av1_get_tx_type(xd_00,plane != 0,blk_row,blk_col,bVar31,(uint)_Var18);
          iVar62 = (x->e_mbd).plane[plane].dst.stride;
          av1_inverse_transform_block
                    (xd_00,ptVar7 + (block << 4),plane,tx_type,(TX_SIZE)local_720,
                     (x->e_mbd).plane[plane].dst.buf + (iVar62 * blk_row + blk_col) * 4,iVar62,
                     (int)local_6e8,(uint)_Var18);
        }
        if (((plane == 0) && (TVar40 != '\0')) && (x->plane[plane].eobs[local_6f0] == 0)) {
          update_txk_array(xd_00,blk_row,blk_col,tx_size,'\0');
        }
      }
      local_728->dqcoeff = ptVar5;
      return;
    }
    uVar23 = txk_map[lVar39];
    if (((uVar23 & 0xff) != 0xff) && (((uVar34 & 0xffff) >> (uVar23 & 0x1f) & 1) != 0)) {
      txfm_param.tx_type = (uint8_t)uVar23;
      local_720 = uVar30;
      local_630 = pqVar28;
      _Var18 = av1_use_qmatrix(pCVar1,xd_00,*(ushort *)&local_5c8->field_0xa7 & 7);
      local_6e8 = CONCAT44(local_6e8._4_4_,uVar23) & 0xffffffff000000ff;
      if (_Var18) {
        av1_setup_qmatrix(pCVar1,xd_00,plane,tx_size,(TX_TYPE)local_6e8,&quant_param);
      }
      if (plane == 0) {
        (x->e_mbd).tx_type_map[local_558] = (uint8_t)uVar23;
      }
      visible_cols = 0x7fffffff;
      iStack_634 = 0;
      local_630._0_4_ = -1;
      local_630._4_4_ = 0x7fffffff;
      local_628 = (qm_val_t *)0x7fffffffffffffff;
      pqStack_620 = (qm_val_t *)0x7fffffffffffffff;
      local_618 = 0;
      if (cVar32 == '\0') {
        av1_xform_dc_only(x,plane,block,&txfm_param,local_5d0);
      }
      else {
        av1_xform(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param);
      }
      uVar30 = (ulong)(x->txfm_search_params).coeff_opt_thresholds[1];
      if (uVar30 != 0xffffffff && ((cVar15 == '\0' && skip_trellis == 0) && bVar64)) {
        iVar62 = (cpi->oxcf).q_cfg.quant_b_adapt;
        ptVar7 = *local_6c8;
        iVar20 = av1_get_tx_scale(tx_size);
        if (cVar32 == '\0') {
          iVar21 = ptVar7[block << 4];
          iVar22 = -iVar21;
          if (0 < iVar21) {
            iVar22 = iVar21;
          }
        }
        else {
          iVar21 = av1_get_max_eob(tx_size);
          iVar22 = (*aom_satd)(ptVar7 + (block << 4),iVar21);
        }
        iVar21 = iVar22 >> (1U - (char)iVar20 & 0x1f);
        if (1 < iVar20) {
          iVar21 = iVar22 << ((char)iVar20 - 1U & 0x1f);
        }
        bVar65 = (long)sqrt_tx_pixels_2d[uVar38] * uVar30 * lVar47 <
                 (ulong)(long)(iVar21 >> ((char)(x->e_mbd).bd - 8U & 0x1f));
        av1_setup_quant(tx_size,(uint)!bVar65,(uint)bVar65,iVar62,&quant_param);
        xd_00 = local_6f8;
      }
      av1_quant(x,plane,block,&txfm_param,&quant_param);
      if (quant_param.use_optimize_b == 0) {
        rate_cost = av1_cost_coeffs_txb(x,plane,block,tx_size,(TX_TYPE)local_6e8,txb_ctx,
                                        (uint)(cpi->common).features.reduced_tx_set_used);
      }
      else {
        av1_optimize_b(cpi,x,plane,block,tx_size,(TX_TYPE)local_6e8,txb_ctx,&rate_cost);
      }
      pqVar28 = (qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630);
      uVar30 = local_720;
      if ((long)x->rdmult * (long)rate_cost + 0x100 >> 9 <= lVar50) {
        if (*(uint16_t *)((long)local_738 + local_6f0 * 2) == 0) {
          pqStack_620 = pqVar55;
          local_630._0_4_ = (int)pqVar55;
          local_630._4_4_ = (int)((ulong)pqVar55 >> 0x20);
          pqVar57 = pqVar55;
          pqVar28 = pqVar55;
        }
        else if (cVar32 == '\0') {
          pqStack_620 = pqVar55;
          pqVar57 = (qm_val_t *)
                    dist_block_px_domain(cpi,x,plane,plane_bsize,block,blk_row,blk_col,tx_size);
          local_630._0_4_ = (int)pqVar57;
          local_630._4_4_ = (int)((ulong)pqVar57 >> 0x20);
          pqVar28 = pqVar57;
        }
        else {
          if ((char)local_748 == '\0') {
            lVar58 = (long)tx_size_2d[uVar38] * 0x4000;
            if ((tx_size == '\x04') ||
               (pqVar57 = (qm_val_t *)0x7fffffffffffffff, lVar58 <= (long)pqVar55)) {
              dist_block_tx_domain
                        (x,plane,block,tx_size,quant_param.qmatrix,
                         av1_scan_orders[txfm_param.tx_size][txfm_param._0_8_ & 0xff].scan,
                         &local_630,(int64_t *)&pqStack_620);
              if ((tx_size != '\x04') || ((long)pqVar55 < lVar58)) {
                pqVar57 = (qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630);
                goto LAB_0021ae8b;
              }
              pqVar57 = (qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630);
              if (((long)pqVar55 - (long)pqStack_620) * 2 < (long)pqStack_620) goto LAB_0021ae8b;
              pqVar57 = pqVar57 + ((long)pqVar55 - (long)pqStack_620);
            }
            else {
LAB_0021ae8b:
              pqVar28 = (qm_val_t *)
                        dist_block_px_domain(cpi,x,plane,plane_bsize,block,blk_row,blk_col,tx_size);
              if ((long)pqVar57 < (long)pqVar28) {
                pqVar57 = pqVar28;
              }
              if ((long)pqVar55 < lVar58) {
                pqVar57 = pqVar28;
              }
            }
            local_630._0_4_ = (int)pqVar57;
            local_630._4_4_ = (int)((ulong)pqVar57 >> 0x20);
            pqStack_620 = pqVar55;
          }
          else {
            dist_block_tx_domain
                      (x,plane,block,tx_size,quant_param.qmatrix,
                       av1_scan_orders[txfm_param.tx_size][txfm_param._0_8_ & 0xff].scan,&local_630,
                       (int64_t *)&pqStack_620);
            pqVar57 = (qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630);
          }
          pqVar28 = (qm_val_t *)CONCAT44(local_630._4_4_,(int)local_630);
        }
        auVar72 = local_708;
        local_630._4_4_ = (int)((ulong)pqVar28 >> 0x20);
        local_630._0_4_ = (int)pqVar28;
        visible_cols = rate_cost;
        lVar58 = (long)pqVar57 * 0x80 + ((long)x->rdmult * (long)rate_cost + 0x100 >> 9);
        uVar30 = local_720;
        if (lVar58 < lVar50) {
          *(ulong *)&best_rd_stats->skip_txfm = CONCAT71(uStack_617,local_618);
          best_rd_stats->rdcost = (int64_t)local_628;
          best_rd_stats->sse = (int64_t)pqStack_620;
          best_rd_stats->rate = rate_cost;
          *(ulong *)&best_rd_stats->zero_rate = CONCAT44((int)local_630,iStack_634);
          *(int *)((long)&best_rd_stats->dist + 4) = local_630._4_4_;
          local_708._1_7_ = (int7)((ulong)local_728->txb_entropy_ctx >> 8);
          local_708[0] = local_728->txb_entropy_ctx[local_6f0];
          local_708._8_8_ = auVar72._8_8_;
          ptVar7 = local_728->dqcoeff;
          uVar3 = local_728->eobs[local_6f0];
          local_728->dqcoeff = local_550;
          uVar30 = (ulong)uVar3;
          lVar50 = lVar58;
          uVar36 = uVar23;
          local_550 = ptVar7;
        }
        TVar40 = (TX_TYPE)uVar36;
        iVar62 = (cpi->sf).tx_sf.adaptive_txb_search_level;
        if ((iVar62 != 0) && (ref_best_rd < lVar50 - (lVar50 >> ((byte)iVar62 & 0x3f))))
        goto LAB_0021b021;
        if (((cpi->sf).tx_sf.tx_type_search.skip_tx_search != 0) && ((short)uVar30 == 0)) {
          uVar30 = 0;
          goto LAB_0021b021;
        }
      }
    }
    lVar39 = lVar39 + 1;
  } while( true );
}

Assistant:

static void search_tx_type(const AV1_COMP *cpi, MACROBLOCK *x, int plane,
                           int block, int blk_row, int blk_col,
                           BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                           const TXB_CTX *const txb_ctx,
                           FAST_TX_SEARCH_MODE ftxs_mode, int skip_trellis,
                           int64_t ref_best_rd, RD_STATS *best_rd_stats) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  int64_t best_rd = INT64_MAX;
  uint16_t best_eob = 0;
  TX_TYPE best_tx_type = DCT_DCT;
  int rate_cost = 0;
  struct macroblock_plane *const p = &x->plane[plane];
  tran_low_t *orig_dqcoeff = p->dqcoeff;
  tran_low_t *best_dqcoeff = x->dqcoeff_buf;
  const int tx_type_map_idx =
      plane ? 0 : blk_row * xd->tx_type_map_stride + blk_col;
  av1_invalid_rd_stats(best_rd_stats);

  skip_trellis |= !is_trellis_used(cpi->optimize_seg_arr[xd->mi[0]->segment_id],
                                   DRY_RUN_NORMAL);

  uint8_t best_txb_ctx = 0;
  // txk_allowed = TX_TYPES: >1 tx types are allowed
  // txk_allowed < TX_TYPES: only that specific tx type is allowed.
  TX_TYPE txk_allowed = TX_TYPES;
  int txk_map[TX_TYPES] = {
    0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15
  };
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = x->plane[plane].dequant_QTX[1] >> dequant_shift;

  const uint8_t txw = tx_size_wide[tx_size];
  const uint8_t txh = tx_size_high[tx_size];
  int64_t block_sse;
  unsigned int block_mse_q8;
  int dc_only_blk = 0;
  const bool predict_dc_block =
      txfm_params->predict_dc_level >= 1 && txw != 64 && txh != 64;
  int64_t per_px_mean = INT64_MAX;
  if (predict_dc_block) {
    predict_dc_only_block(x, plane, plane_bsize, tx_size, block, blk_row,
                          blk_col, best_rd_stats, &block_sse, &block_mse_q8,
                          &per_px_mean, &dc_only_blk);
    if (best_rd_stats->skip_txfm == 1) {
      const TX_TYPE tx_type = DCT_DCT;
      if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
      return;
    }
  } else {
    block_sse = av1_pixel_diff_dist(x, plane, blk_row, blk_col, plane_bsize,
                                    txsize_to_bsize[tx_size], &block_mse_q8);
    assert(block_mse_q8 != UINT_MAX);
  }

  // Bit mask to indicate which transform types are allowed in the RD search.
  uint16_t tx_mask;

  // Use DCT_DCT transform for DC only block.
  if (dc_only_blk || cpi->sf.rt_sf.dct_only_palette_nonrd == 1)
    tx_mask = 1 << DCT_DCT;
  else
    tx_mask = get_tx_mask(cpi, x, plane, block, blk_row, blk_col, plane_bsize,
                          tx_size, txb_ctx, ftxs_mode, ref_best_rd,
                          &txk_allowed, txk_map);
  const uint16_t allowed_tx_mask = tx_mask;

  if (is_cur_buf_hbd(xd)) {
    block_sse = ROUND_POWER_OF_TWO(block_sse, (xd->bd - 8) * 2);
    block_mse_q8 = ROUND_POWER_OF_TWO(block_mse_q8, (xd->bd - 8) * 2);
  }
  block_sse *= 16;
  // Use mse / qstep^2 based threshold logic to take decision of R-D
  // optimization of coeffs. For smaller residuals, coeff optimization
  // would be helpful. For larger residuals, R-D optimization may not be
  // effective.
  // TODO(any): Experiment with variance and mean based thresholds
  const int perform_block_coeff_opt =
      ((uint64_t)block_mse_q8 <=
       (uint64_t)txfm_params->coeff_opt_thresholds[0] * qstep * qstep);
  skip_trellis |= !perform_block_coeff_opt;

  // Flag to indicate if distortion should be calculated in transform domain or
  // not during iterating through transform type candidates.
  // Transform domain distortion is accurate for higher residuals.
  // TODO(any): Experiment with variance and mean based thresholds
  int use_transform_domain_distortion =
      (txfm_params->use_transform_domain_distortion > 0) &&
      (block_mse_q8 >= txfm_params->tx_domain_dist_threshold) &&
      // Any 64-pt transforms only preserves half the coefficients.
      // Therefore transform domain distortion is not valid for these
      // transform sizes.
      (txsize_sqr_up_map[tx_size] != TX_64X64) &&
      // Use pixel domain distortion for DC only blocks
      !dc_only_blk;
  // Flag to indicate if an extra calculation of distortion in the pixel domain
  // should be performed at the end, after the best transform type has been
  // decided.
  int calc_pixel_domain_distortion_final =
      txfm_params->use_transform_domain_distortion == 1 &&
      use_transform_domain_distortion && x->rd_model != LOW_TXFM_RD;
  if (calc_pixel_domain_distortion_final &&
      (txk_allowed < TX_TYPES || allowed_tx_mask == 0x0001))
    calc_pixel_domain_distortion_final = use_transform_domain_distortion = 0;

  const uint16_t *eobs_ptr = x->plane[plane].eobs;

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  int skip_trellis_based_on_satd[TX_TYPES] = { 0 };
  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, !skip_trellis,
                  skip_trellis ? (USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B
                                                         : AV1_XFORM_QUANT_FP)
                               : AV1_XFORM_QUANT_FP,
                  cpi->oxcf.q_cfg.quant_b_adapt, &quant_param);

  // Iterate through all transform type candidates.
  for (int idx = 0; idx < TX_TYPES; ++idx) {
    const TX_TYPE tx_type = (TX_TYPE)txk_map[idx];
    if (tx_type == TX_TYPE_INVALID || !check_bit_mask(allowed_tx_mask, tx_type))
      continue;
    txfm_param.tx_type = tx_type;
    if (av1_use_qmatrix(&cm->quant_params, xd, mbmi->segment_id)) {
      av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                        &quant_param);
    }
    if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
    RD_STATS this_rd_stats;
    av1_invalid_rd_stats(&this_rd_stats);

    if (!dc_only_blk)
      av1_xform(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param);
    else
      av1_xform_dc_only(x, plane, block, &txfm_param, per_px_mean);

    skip_trellis_based_on_satd[tx_type] = skip_trellis_opt_based_on_satd(
        x, &quant_param, plane, block, tx_size, cpi->oxcf.q_cfg.quant_b_adapt,
        qstep, txfm_params->coeff_opt_thresholds[1], skip_trellis, dc_only_blk);

    av1_quant(x, plane, block, &txfm_param, &quant_param);

    // Calculate rate cost of quantized coefficients.
    if (quant_param.use_optimize_b) {
      // TODO(aomedia:3209): update Trellis quantization to take into account
      // quantization matrices.
      av1_optimize_b(cpi, x, plane, block, tx_size, tx_type, txb_ctx,
                     &rate_cost);
    } else {
      rate_cost = cost_coeffs(x, plane, block, tx_size, tx_type, txb_ctx,
                              cm->features.reduced_tx_set_used);
    }

    // If rd cost based on coeff rate alone is already more than best_rd,
    // terminate early.
    if (RDCOST(x->rdmult, rate_cost, 0) > best_rd) continue;

    // Calculate distortion.
    if (eobs_ptr[block] == 0) {
      // When eob is 0, pixel domain distortion is more efficient and accurate.
      this_rd_stats.dist = this_rd_stats.sse = block_sse;
    } else if (dc_only_blk) {
      this_rd_stats.sse = block_sse;
      this_rd_stats.dist = dist_block_px_domain(
          cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    } else if (use_transform_domain_distortion) {
      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);
    } else {
      int64_t sse_diff = INT64_MAX;
      // high_energy threshold assumes that every pixel within a txfm block
      // has a residue energy of at least 25% of the maximum, i.e. 128 * 128
      // for 8 bit.
      const int64_t high_energy_thresh =
          ((int64_t)128 * 128 * tx_size_2d[tx_size]);
      const int is_high_energy = (block_sse >= high_energy_thresh);
      if (tx_size == TX_64X64 || is_high_energy) {
        // Because 3 out 4 quadrants of transform coefficients are forced to
        // zero, the inverse transform has a tendency to overflow. sse_diff
        // is effectively the energy of those 3 quadrants, here we use it
        // to decide if we should do pixel domain distortion. If the energy
        // is mostly in first quadrant, then it is unlikely that we have
        // overflow issue in inverse transform.
        const SCAN_ORDER *const scan_order =
            get_scan(txfm_param.tx_size, txfm_param.tx_type);
        dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                             scan_order->scan, &this_rd_stats.dist,
                             &this_rd_stats.sse);
        sse_diff = block_sse - this_rd_stats.sse;
      }
      if (tx_size != TX_64X64 || !is_high_energy ||
          (sse_diff * 2) < this_rd_stats.sse) {
        const int64_t tx_domain_dist = this_rd_stats.dist;
        this_rd_stats.dist = dist_block_px_domain(
            cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
        // For high energy blocks, occasionally, the pixel domain distortion
        // can be artificially low due to clamping at reconstruction stage
        // even when inverse transform output is hugely different from the
        // actual residue.
        if (is_high_energy && this_rd_stats.dist < tx_domain_dist)
          this_rd_stats.dist = tx_domain_dist;
      } else {
        assert(sse_diff < INT64_MAX);
        this_rd_stats.dist += sse_diff;
      }
      this_rd_stats.sse = block_sse;
    }

    this_rd_stats.rate = rate_cost;

    const int64_t rd =
        RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);

    if (rd < best_rd) {
      best_rd = rd;
      *best_rd_stats = this_rd_stats;
      best_tx_type = tx_type;
      best_txb_ctx = x->plane[plane].txb_entropy_ctx[block];
      best_eob = x->plane[plane].eobs[block];
      // Swap dqcoeff buffers
      tran_low_t *const tmp_dqcoeff = best_dqcoeff;
      best_dqcoeff = p->dqcoeff;
      p->dqcoeff = tmp_dqcoeff;
    }

#if CONFIG_COLLECT_RD_STATS == 1
    if (plane == 0) {
      PrintTransformUnitStats(cpi, x, &this_rd_stats, blk_row, blk_col,
                              plane_bsize, tx_size, tx_type, rd);
    }
#endif  // CONFIG_COLLECT_RD_STATS == 1

#if COLLECT_TX_SIZE_DATA
    // Generate small sample to restrict output size.
    static unsigned int seed = 21743;
    if (lcg_rand16(&seed) % 200 == 0) {
      FILE *fp = NULL;

      if (within_border) {
        fp = fopen(av1_tx_size_data_output_file, "a");
      }

      if (fp) {
        // Transform info and RD
        const int txb_w = tx_size_wide[tx_size];
        const int txb_h = tx_size_high[tx_size];

        // Residue signal.
        const int diff_stride = block_size_wide[plane_bsize];
        struct macroblock_plane *const p = &x->plane[plane];
        const int16_t *src_diff =
            &p->src_diff[(blk_row * diff_stride + blk_col) * 4];

        for (int r = 0; r < txb_h; ++r) {
          for (int c = 0; c < txb_w; ++c) {
            fprintf(fp, "%d,", src_diff[c]);
          }
          src_diff += diff_stride;
        }

        fprintf(fp, "%d,%d,%d,%" PRId64, txb_w, txb_h, tx_type, rd);
        fprintf(fp, "\n");
        fclose(fp);
      }
    }
#endif  // COLLECT_TX_SIZE_DATA

    // If the current best RD cost is much worse than the reference RD cost,
    // terminate early.
    if (cpi->sf.tx_sf.adaptive_txb_search_level) {
      if ((best_rd - (best_rd >> cpi->sf.tx_sf.adaptive_txb_search_level)) >
          ref_best_rd) {
        break;
      }
    }

    // Terminate transform type search if the block has been quantized to
    // all zero.
    if (cpi->sf.tx_sf.tx_type_search.skip_tx_search && !best_eob) break;
  }

  assert(best_rd != INT64_MAX);

  best_rd_stats->skip_txfm = best_eob == 0;
  if (plane == 0) update_txk_array(xd, blk_row, blk_col, tx_size, best_tx_type);
  x->plane[plane].txb_entropy_ctx[block] = best_txb_ctx;
  x->plane[plane].eobs[block] = best_eob;
  skip_trellis = skip_trellis_based_on_satd[best_tx_type];

  // Point dqcoeff to the quantized coefficients corresponding to the best
  // transform type, then we can skip transform and quantization, e.g. in the
  // final pixel domain distortion calculation and recon_intra().
  p->dqcoeff = best_dqcoeff;

  if (calc_pixel_domain_distortion_final && best_eob) {
    best_rd_stats->dist = dist_block_px_domain(
        cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    best_rd_stats->sse = block_sse;
  }

  // Intra mode needs decoded pixels such that the next transform block
  // can use them for prediction.
  recon_intra(cpi, x, plane, block, blk_row, blk_col, plane_bsize, tx_size,
              txb_ctx, skip_trellis, best_tx_type, 0, &rate_cost, best_eob);
  p->dqcoeff = orig_dqcoeff;
}